

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O3

void op_addImm(MCInst *MI,int v)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x3e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    *(long *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x46) =
         (long)v;
    if (MI->csh->syntax == 1) {
      pcVar3 = MI->flat_insn->detail;
      bVar2 = (pcVar3->field_6).x86.op_count;
      if (bVar2 == 0) {
        *(uint8_t *)((long)&pcVar3->field_6 + 0x50) = MI->imm_size;
      }
      else {
        pcVar3->groups[(ulong)((uint)bVar2 * 0x30) + 0x5e] =
             *(uint8_t *)((long)&pcVar3->field_6 + 0x50);
      }
    }
    else {
      MI->has_imm = true;
    }
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  if (MI->op1_size != '\0') {
    return;
  }
  MI->op1_size = MI->imm_size;
  return;
}

Assistant:

void op_addImm(MCInst *MI, int v)
{
	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = v;
		// if op_count > 0, then this operand's size is taken from the destination op
		if (MI->csh->syntax == CS_OPT_SYNTAX_INTEL) {
			if (MI->flat_insn->detail->x86.op_count > 0)
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->flat_insn->detail->x86.operands[0].size;
			else
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;
		} else
			MI->has_imm = true;
		MI->flat_insn->detail->x86.op_count++;
	}

	if (MI->op1_size == 0)
		MI->op1_size = MI->imm_size;
}